

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86_avx2::forward_int8
          (Padding_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  Mat *pMVar14;
  long lVar15;
  _func_int *p_Var16;
  ulong uVar17;
  Mat *pMVar18;
  undefined8 *puVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  undefined8 *puVar23;
  long lVar24;
  undefined8 *puVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar39 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar40 [64];
  _func_int **local_180;
  Mat local_158;
  ulong local_110;
  ulong local_108;
  uint local_fc;
  size_t local_f8;
  size_t local_f0;
  void *local_e8;
  ulong local_e0;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  Option opt_pack1;
  
  auVar33 = in_ZMM4._0_32_;
  auVar35 = in_ZMM5._0_32_;
  uVar22 = bottom_blob->c;
  uVar30 = (ulong)uVar22;
  local_158.elemsize = bottom_blob->elemsize;
  local_158.elempack = bottom_blob->elempack;
  local_158.dims = bottom_blob->dims;
  local_158.w = bottom_blob->w;
  local_158.h = bottom_blob->h;
  iVar11 = bottom_blob->d;
  local_158.d = bottom_blob->d;
  local_158.c = bottom_blob->c;
  if (local_158.elempack == 8) {
    local_110 = uVar30;
    switch(local_158.dims) {
    case 1:
      p_Var16 = this->_vptr_Padding_x86_avx2[-3];
      uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var16) + local_158.w * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var16);
      bVar31 = (uVar22 & 7) == 0;
      if ((bVar31 && (*(uint *)(&this->field_0xd8 + (long)p_Var16) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var16) == 0)) {
        Mat::create(top_blob,(int)uVar22 >> 3,(local_158.elemsize >> 3) << bVar31 * '\x03',8,
                    opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var16 = this->_vptr_Padding_x86_avx2[-3];
          uVar30 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var16);
          iVar11 = *(int *)(&this->field_0xd8 + (long)p_Var16);
          iVar10 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar10 = iVar11;
          }
          iVar11 = *(int *)(&this->field_0xdc + (long)p_Var16);
          iVar8 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar8 = iVar11;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                     iVar10 >> 3,iVar8 >> 3,
                     uVar30 << 0x38 | uVar30 << 0x30 | uVar30 << 0x28 |
                     uVar30 << 0x20 | uVar30 << 0x18 | uVar30 << 0x10 | uVar30 << 8 | uVar30);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      p_Var16 = this->_vptr_Padding_x86_avx2[-3];
      uVar22 = *(uint *)(&this->field_0xd0 + (long)p_Var16) + local_158.h * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var16);
      bVar31 = (uVar22 & 7) == 0;
      if ((bVar31 && (*(uint *)(&this->field_0xd0 + (long)p_Var16) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var16) == 0)) {
        Mat::create(top_blob,local_158.w + *(int *)(&this->field_0xd8 + (long)p_Var16) +
                             *(int *)(&this->field_0xdc + (long)p_Var16),(int)uVar22 >> 3,
                    (local_158.elemsize >> 3) << bVar31 * '\x03',8,opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var16 = this->_vptr_Padding_x86_avx2[-3];
          uVar30 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var16);
          iVar11 = *(int *)(&this->field_0xd0 + (long)p_Var16);
          iVar10 = *(int *)(&this->field_0xd4 + (long)p_Var16);
          iVar8 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar8 = iVar11;
          }
          iVar11 = iVar10 + 7;
          if (-1 < iVar10) {
            iVar11 = iVar10;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                     iVar8 >> 3,iVar11 >> 3,*(int *)(&this->field_0xd8 + (long)p_Var16),
                     *(int *)(&this->field_0xdc + (long)p_Var16),
                     uVar30 << 0x38 | uVar30 << 0x30 | uVar30 << 0x28 |
                     uVar30 << 0x20 | uVar30 << 0x18 | uVar30 << 0x10 | uVar30 << 8 | uVar30);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      p_Var16 = this->_vptr_Padding_x86_avx2[-3];
      uVar12 = *(uint *)(&this->field_0xe8 + (long)p_Var16) + uVar22 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var16);
      bVar31 = (uVar12 & 7) == 0;
      if (bVar31 && (*(uint *)(&this->field_0xe8 + (long)p_Var16) & 7) == 0) {
        if ((uVar12 == uVar22 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var16) == 0)) {
          uVar12 = (int)uVar12 >> 3;
          Mat::create(top_blob,local_158.w + *(int *)(&this->field_0xd8 + (long)p_Var16) +
                               *(int *)(&this->field_0xdc + (long)p_Var16),
                      local_158.h + *(int *)(&this->field_0xd0 + (long)p_Var16) +
                      *(int *)(&this->field_0xd4 + (long)p_Var16),uVar12,
                      (local_158.elemsize >> 3) << bVar31 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          local_180 = this->_vptr_Padding_x86_avx2;
          iVar11 = *(int *)(&this->field_0xe8 + (long)local_180[-3]);
          iVar10 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar10 = iVar11;
          }
          if ((int)uVar12 < 1) {
            return 0;
          }
          uVar22 = -(iVar10 >> 3);
          uVar13 = (ulong)uVar12;
          uVar29 = 0;
          auVar33 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar37 = ZEXT3264(auVar33);
          local_98._8_8_ = 0x8000000000000000;
          local_98._0_8_ = 0x8000000000000000;
          local_98._16_8_ = 0x8000000000000000;
          local_98._24_8_ = 0x8000000000000000;
          auVar38 = ZEXT3264(local_98);
          auVar33 = vpcmpeqd_avx2(auVar35,auVar35);
          auVar39 = ZEXT3264(auVar33);
          uVar12 = uVar22;
          local_fc = uVar22;
          local_e0 = uVar13;
          do {
            auVar33 = local_b8;
            local_b8._4_4_ = 0;
            local_b8._0_4_ = uVar12;
            local_b8._8_24_ = auVar33._8_24_;
            pvVar5 = top_blob->data;
            sVar6 = top_blob->elemsize;
            p_Var16 = local_180[-3];
            uVar17 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var16);
            sVar4 = top_blob->cstep;
            uVar17 = uVar17 << 0x38 | uVar17 << 0x30 | uVar17 << 0x28 |
                     uVar17 << 0x20 | uVar17 << 0x18 | uVar17 << 0x10 | uVar17 << 8 | uVar17;
            local_d8._0_8_ = uVar29;
            uVar12 = uVar22 + (int)uVar29;
            if ((int)uVar12 < 0 || (int)uVar30 <= (int)uVar12) {
              iVar11 = 1;
              if (top_blob->dims != 3) {
                iVar11 = top_blob->d;
              }
              uVar12 = top_blob->w * top_blob->h * iVar11;
              if ((int)uVar12 < 1) goto LAB_002b1c3a;
              lVar15 = (ulong)uVar12 - 1;
              auVar34._8_8_ = lVar15;
              auVar34._0_8_ = lVar15;
              auVar34._16_8_ = lVar15;
              auVar34._24_8_ = lVar15;
              auVar32._8_8_ = uVar17;
              auVar32._0_8_ = uVar17;
              auVar32._16_8_ = uVar17;
              auVar32._24_8_ = uVar17;
              uVar17 = 0;
              do {
                auVar36._8_8_ = uVar17;
                auVar36._0_8_ = uVar17;
                auVar36._16_8_ = uVar17;
                auVar36._24_8_ = uVar17;
                auVar33 = vpor_avx2(auVar36,auVar37._0_32_);
                auVar33 = vpcmpgtq_avx2(auVar33 ^ auVar38._0_32_,auVar34 ^ auVar38._0_32_);
                auVar33 = vpmaskmovq_avx2(auVar33 ^ auVar39._0_32_,auVar32);
                *(undefined1 (*) [32])((long)pvVar5 + uVar17 * 8 + sVar4 * sVar6 * uVar29) = auVar33
                ;
                uVar17 = uVar17 + 4;
              } while ((uVar12 + 3 & 0xfffffffc) != uVar17);
            }
            else {
              bVar31 = bottom_blob->dims == 3;
              local_158.c = 1;
              if (!bVar31) {
                local_158.c = bottom_blob->d;
              }
              pMVar14 = (Mat *)((long)pvVar5 + sVar4 * uVar29 * sVar6);
              iVar11 = bottom_blob->w;
              lVar15 = (long)iVar11;
              iVar10 = bottom_blob->h;
              local_158.dims = bVar31 ^ 3;
              local_e8 = bottom_blob->data;
              local_158.elemsize = bottom_blob->elemsize;
              local_f0 = bottom_blob->cstep;
              puVar25 = (undefined8 *)(uVar12 * local_f0 * local_158.elemsize + (long)local_e8);
              local_158.elempack = bottom_blob->elempack;
              local_158.allocator = bottom_blob->allocator;
              local_158.refcount = (int *)0x0;
              local_158.cstep = iVar10 * lVar15;
              local_158.d = 1;
              iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var16);
              local_f8 = local_158.elemsize;
              if (iVar8 == 0) {
                auVar33 = ZEXT1632(auVar39._0_16_);
                local_158.data = puVar25;
                local_158.w = iVar11;
                local_158.h = iVar10;
                padding_constant_pack8_int8_sse
                          ((ncnn *)&local_158,pMVar14,(Mat *)(ulong)(uint)top_blob->w,
                           *(int *)(&this->field_0xd0 + (long)p_Var16),
                           *(int *)(&this->field_0xd4 + (long)p_Var16),
                           *(int *)(&this->field_0xd8 + (long)p_Var16),
                           *(int *)(&this->field_0xdc + (long)p_Var16),uVar17);
                auVar33 = vpcmpeqd_avx2(auVar33,auVar33);
                auVar39 = ZEXT3264(auVar33);
                auVar38 = ZEXT3264(local_98);
                auVar33 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                auVar37 = ZEXT3264(auVar33);
                local_180 = this->_vptr_Padding_x86_avx2;
                p_Var16 = local_180[-3];
                iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var16);
              }
              if (iVar8 == 1) {
                iVar8 = *(int *)(&this->field_0xd0 + (long)p_Var16);
                iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var16);
                iVar9 = *(int *)(&this->field_0xd8 + (long)p_Var16);
                iVar2 = *(int *)(&this->field_0xdc + (long)p_Var16);
                pMVar18 = pMVar14;
                if (0 < iVar8) {
                  lVar20 = local_f0 * local_f8 * local_b8._0_8_;
                  iVar21 = 0;
                  do {
                    if (0 < iVar9) {
                      pvVar5 = (void *)*puVar25;
                      iVar26 = iVar9;
                      do {
                        pMVar18->data = pvVar5;
                        pMVar18 = (Mat *)&pMVar18->refcount;
                        iVar26 = iVar26 + -1;
                      } while (iVar26 != 0);
                    }
                    puVar19 = puVar25;
                    if (0 < iVar11) {
                      lVar24 = 0;
                      lVar27 = 0;
                      do {
                        (&pMVar18->data)[lVar27] = *(void **)((long)local_e8 + lVar27 * 8 + lVar20);
                        lVar27 = lVar27 + 1;
                        lVar24 = lVar24 + -8;
                      } while (iVar11 != (int)lVar27);
                      pMVar18 = (Mat *)((long)pMVar18 - lVar24);
                      puVar19 = (undefined8 *)((long)local_e8 + (lVar20 - lVar24));
                    }
                    if (0 < iVar2) {
                      pvVar5 = (void *)puVar19[-1];
                      iVar26 = iVar2;
                      do {
                        pMVar18->data = pvVar5;
                        pMVar18 = (Mat *)&pMVar18->refcount;
                        iVar26 = iVar26 + -1;
                      } while (iVar26 != 0);
                    }
                    iVar21 = iVar21 + 1;
                  } while (iVar21 != iVar8);
                }
                puVar19 = puVar25;
                if (0 < iVar10) {
                  iVar8 = 0;
                  do {
                    if (0 < iVar9) {
                      pvVar5 = (void *)*puVar19;
                      iVar21 = iVar9;
                      do {
                        pMVar18->data = pvVar5;
                        pMVar18 = (Mat *)&pMVar18->refcount;
                        iVar21 = iVar21 + -1;
                      } while (iVar21 != 0);
                    }
                    if (0 < iVar11) {
                      lVar20 = 0;
                      lVar24 = 0;
                      do {
                        (&pMVar18->data)[lVar24] = (void *)puVar19[lVar24];
                        lVar24 = lVar24 + 1;
                        lVar20 = lVar20 + -8;
                      } while (iVar11 != (int)lVar24);
                      pMVar18 = (Mat *)((long)pMVar18 - lVar20);
                      puVar19 = (undefined8 *)((long)puVar19 - lVar20);
                    }
                    if (0 < iVar2) {
                      pvVar5 = (void *)puVar19[-1];
                      iVar21 = iVar2;
                      do {
                        pMVar18->data = pvVar5;
                        pMVar18 = (Mat *)&pMVar18->refcount;
                        iVar21 = iVar21 + -1;
                      } while (iVar21 != 0);
                    }
                    iVar8 = iVar8 + 1;
                  } while (iVar8 != iVar10);
                }
                if (0 < iVar1) {
                  puVar19 = puVar19 + -lVar15;
                  iVar8 = 0;
                  do {
                    if (0 < iVar9) {
                      pvVar5 = (void *)*puVar19;
                      iVar21 = iVar9;
                      do {
                        pMVar18->data = pvVar5;
                        pMVar18 = (Mat *)&pMVar18->refcount;
                        iVar21 = iVar21 + -1;
                      } while (iVar21 != 0);
                    }
                    puVar23 = puVar19;
                    if (0 < iVar11) {
                      lVar20 = 0;
                      lVar24 = 0;
                      do {
                        (&pMVar18->data)[lVar24] = (void *)puVar19[lVar24];
                        lVar24 = lVar24 + 1;
                        lVar20 = lVar20 + -8;
                      } while (iVar11 != (int)lVar24);
                      pMVar18 = (Mat *)((long)pMVar18 - lVar20);
                      puVar23 = (undefined8 *)((long)puVar19 - lVar20);
                    }
                    if (0 < iVar2) {
                      pvVar5 = (void *)puVar23[-1];
                      iVar21 = iVar2;
                      do {
                        pMVar18->data = pvVar5;
                        pMVar18 = (Mat *)&pMVar18->refcount;
                        iVar21 = iVar21 + -1;
                      } while (iVar21 != 0);
                    }
                    iVar8 = iVar8 + 1;
                  } while (iVar8 != iVar1);
                }
              }
              p_Var16 = local_180[-3];
              uVar13 = local_e0;
              uVar30 = local_110;
              uVar22 = local_fc;
              if (*(int *)(&this->field_0xe0 + (long)p_Var16) == 2) {
                iVar8 = *(int *)(&this->field_0xd0 + (long)p_Var16);
                iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var16);
                uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var16);
                lVar24 = (long)(int)uVar12;
                uVar29 = (ulong)uVar12;
                uVar3 = *(uint *)(&this->field_0xdc + (long)p_Var16);
                uVar17 = (ulong)uVar3;
                lVar20 = (long)(iVar11 * iVar8);
                local_108 = CONCAT44(local_108._4_4_,iVar8);
                if (iVar8 < 1) {
                  puVar25 = puVar25 + lVar20;
                }
                else {
                  lVar27 = local_f0 * local_f8 * local_b8._0_8_;
                  lVar28 = lVar27 + lVar24 * 8 + lVar20 * 8 + (long)local_e8;
                  puVar25 = (undefined8 *)(lVar27 + lVar20 * 8 + (long)local_e8);
                  iVar9 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      lVar20 = 0;
                      do {
                        pMVar14->data = *(void **)(lVar28 + lVar20 * 8);
                        pMVar14 = (Mat *)&pMVar14->refcount;
                        lVar20 = lVar20 + -1;
                      } while (-lVar20 != uVar29);
                    }
                    puVar19 = puVar25;
                    if (0 < iVar11) {
                      lVar27 = 0;
                      lVar20 = 0;
                      do {
                        (&pMVar14->data)[lVar20] = (void *)puVar25[lVar20];
                        lVar20 = lVar20 + 1;
                        lVar27 = lVar27 + -8;
                      } while (iVar11 != (int)lVar20);
                      pMVar14 = (Mat *)((long)pMVar14 - lVar27);
                      puVar19 = (undefined8 *)((long)puVar25 - lVar27);
                    }
                    if (0 < (int)uVar3) {
                      lVar20 = 0;
                      do {
                        pMVar14->data = (void *)puVar19[lVar20 + -2];
                        pMVar14 = (Mat *)&pMVar14->refcount;
                        lVar20 = lVar20 + -1;
                      } while (-lVar20 != uVar17);
                    }
                    puVar25 = puVar25 + -lVar15;
                    iVar9 = iVar9 + 1;
                    lVar28 = lVar28 + lVar15 * -8;
                  } while (iVar9 != iVar8);
                }
                if (0 < iVar10) {
                  iVar8 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      lVar20 = 0;
                      do {
                        pMVar14->data = (void *)puVar25[lVar24 + lVar20];
                        pMVar14 = (Mat *)&pMVar14->refcount;
                        lVar20 = lVar20 + -1;
                      } while (-lVar20 != uVar29);
                    }
                    if (0 < iVar11) {
                      lVar20 = 0;
                      lVar27 = 0;
                      do {
                        (&pMVar14->data)[lVar27] = (void *)puVar25[lVar27];
                        lVar27 = lVar27 + 1;
                        lVar20 = lVar20 + -8;
                      } while (iVar11 != (int)lVar27);
                      pMVar14 = (Mat *)((long)pMVar14 - lVar20);
                      puVar25 = (undefined8 *)((long)puVar25 - lVar20);
                    }
                    if (0 < (int)uVar3) {
                      lVar20 = 0;
                      do {
                        pMVar14->data = (void *)puVar25[lVar20 + -2];
                        pMVar14 = (Mat *)&pMVar14->refcount;
                        lVar20 = lVar20 + -1;
                      } while (-lVar20 != uVar17);
                    }
                    iVar8 = iVar8 + 1;
                  } while (iVar8 != iVar10);
                }
                if (0 < iVar1) {
                  puVar19 = puVar25 + -(long)(iVar11 * 2);
                  puVar25 = puVar25 + (lVar24 - iVar11 * 2);
                  iVar10 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      lVar20 = 0;
                      do {
                        pMVar14->data = (void *)puVar25[lVar20];
                        pMVar14 = (Mat *)&pMVar14->refcount;
                        lVar20 = lVar20 + -1;
                      } while (-lVar20 != uVar29);
                    }
                    puVar23 = puVar19;
                    if (0 < iVar11) {
                      lVar24 = 0;
                      lVar20 = 0;
                      do {
                        (&pMVar14->data)[lVar20] = (void *)puVar19[lVar20];
                        lVar20 = lVar20 + 1;
                        lVar24 = lVar24 + -8;
                      } while (iVar11 != (int)lVar20);
                      pMVar14 = (Mat *)((long)pMVar14 - lVar24);
                      puVar23 = (undefined8 *)((long)puVar19 - lVar24);
                    }
                    if (0 < (int)uVar3) {
                      lVar20 = 0;
                      do {
                        pMVar14->data = (void *)puVar23[lVar20 + -2];
                        pMVar14 = (Mat *)&pMVar14->refcount;
                        lVar20 = lVar20 + -1;
                      } while (-lVar20 != uVar17);
                    }
                    puVar19 = puVar19 + -lVar15;
                    iVar10 = iVar10 + 1;
                    puVar25 = puVar25 + -lVar15;
                  } while (iVar10 != iVar1);
                }
              }
LAB_002b1c3a:
              uVar29 = local_d8._0_8_;
            }
            uVar29 = uVar29 + 1;
            uVar12 = local_b8._0_4_ + 1;
            if (uVar29 == uVar13) {
              return 0;
            }
          } while( true );
        }
      }
      break;
    case 4:
      p_Var16 = this->_vptr_Padding_x86_avx2[-3];
      if (*(int *)(&this->field_0xe0 + (long)p_Var16) == 0) {
        uVar12 = *(int *)(&this->field_0xe8 + (long)p_Var16) + iVar11 +
                 *(int *)(&this->field_0xec + (long)p_Var16);
        Mat::create(top_blob,local_158.w + *(int *)(&this->field_0xd8 + (long)p_Var16) +
                             *(int *)(&this->field_0xdc + (long)p_Var16),
                    local_158.h + *(int *)(&this->field_0xd0 + (long)p_Var16) +
                    *(int *)(&this->field_0xd4 + (long)p_Var16),uVar12,uVar22,local_158.elemsize,8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if ((int)uVar22 < 1) {
            return 0;
          }
          uVar30 = 0;
          auVar35 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar37 = ZEXT3264(auVar35);
          local_b8._8_8_ = 0x8000000000000000;
          local_b8._0_8_ = 0x8000000000000000;
          local_b8._16_8_ = 0x8000000000000000;
          local_b8._24_8_ = 0x8000000000000000;
          auVar38 = ZEXT3264(local_b8);
          auVar33 = vpcmpeqd_avx2(auVar33,auVar33);
          auVar39 = ZEXT3264(auVar33);
          do {
            if (0 < (int)uVar12) {
              local_108 = (ulong)*(float *)(&this->field_0xe4 +
                                           (long)this->_vptr_Padding_x86_avx2[-3]);
              local_108 = local_108 << 0x38 | local_108 << 0x30 | local_108 << 0x28 |
                          local_108 << 0x20 | local_108 << 0x18 | local_108 << 0x10 | local_108 << 8
                          | local_108;
              local_d8._8_8_ = local_108;
              local_d8._0_8_ = local_108;
              local_d8._16_8_ = local_108;
              local_d8._24_8_ = local_108;
              auVar40 = ZEXT3264(local_d8);
              uVar29 = 0;
              do {
                pMVar14 = (Mat *)(long)top_blob->w;
                iVar10 = top_blob->h;
                pvVar5 = top_blob->data;
                sVar6 = top_blob->elemsize;
                lVar20 = top_blob->cstep * uVar30;
                lVar15 = (long)iVar10 * (long)pMVar14;
                p_Var16 = this->_vptr_Padding_x86_avx2[-3];
                uVar22 = (int)uVar29 - *(int *)(&this->field_0xe8 + (long)p_Var16);
                if ((int)uVar22 < 0 || iVar11 <= (int)uVar22) {
                  uVar22 = (uint)lVar15;
                  if (0 < (int)uVar22) {
                    lVar15 = (ulong)(uVar22 & 0x7fffffff) - 1;
                    auVar33._8_8_ = lVar15;
                    auVar33._0_8_ = lVar15;
                    auVar33._16_8_ = lVar15;
                    auVar33._24_8_ = lVar15;
                    uVar13 = 0;
                    do {
                      auVar35._8_8_ = uVar13;
                      auVar35._0_8_ = uVar13;
                      auVar35._16_8_ = uVar13;
                      auVar35._24_8_ = uVar13;
                      auVar35 = vpor_avx2(auVar35,auVar37._0_32_);
                      auVar35 = vpcmpgtq_avx2(auVar35 ^ auVar38._0_32_,auVar33 ^ auVar38._0_32_);
                      auVar35 = vpmaskmovq_avx2(auVar35 ^ auVar39._0_32_,auVar40._0_32_);
                      *(undefined1 (*) [32])
                       ((long)pvVar5 +
                       uVar13 * 8 + sVar6 * ((long)iVar10 * uVar29 * (long)pMVar14 + lVar20)) =
                           auVar35;
                      uVar13 = uVar13 + 4;
                    } while ((uVar22 + 3 & 0xfffffffc) != uVar13);
                  }
                }
                else {
                  local_158.w = bottom_blob->w;
                  local_158.elemsize = bottom_blob->elemsize;
                  local_158.h = bottom_blob->h;
                  local_158.cstep = (long)local_158.h * (long)local_158.w;
                  local_158.elempack = bottom_blob->elempack;
                  local_158.data =
                       (void *)((long)bottom_blob->data +
                               local_158.elemsize * local_158.cstep * (ulong)uVar22 +
                               bottom_blob->cstep * uVar30 * local_158.elemsize);
                  local_158.allocator = bottom_blob->allocator;
                  local_158.refcount = (int *)0x0;
                  local_158.dims = 2;
                  local_158.d = 1;
                  local_158.c = 1;
                  auVar33 = ZEXT1632(auVar39._0_16_);
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&local_158,
                             (Mat *)((long)pvVar5 + lVar15 * sVar6 * uVar29 + lVar20 * sVar6),
                             pMVar14,*(int *)(&this->field_0xd0 + (long)p_Var16),
                             *(int *)(&this->field_0xd4 + (long)p_Var16),
                             *(int *)(&this->field_0xd8 + (long)p_Var16),
                             *(int *)(&this->field_0xdc + (long)p_Var16),local_108);
                  auVar40 = ZEXT3264(local_d8);
                  auVar33 = vpcmpeqd_avx2(auVar33,auVar33);
                  auVar39 = ZEXT3264(auVar33);
                  auVar38 = ZEXT3264(local_b8);
                  auVar33 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                  auVar37 = ZEXT3264(auVar33);
                }
                uVar29 = uVar29 + 1;
              } while (uVar29 != uVar12);
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != local_110);
          return 0;
        }
        return -100;
      }
    }
  }
  piVar7 = bottom_blob->refcount;
  local_158.data = bottom_blob->data;
  local_158.refcount = bottom_blob->refcount;
  local_158.allocator = bottom_blob->allocator;
  local_158.cstep = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  if (local_158.elempack != 1) {
    opt_pack1.lightmode = opt->lightmode;
    opt_pack1._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_pack1.num_threads = opt->num_threads;
    opt_pack1.workspace_allocator = opt->workspace_allocator;
    opt_pack1.openmp_blocktime = opt->openmp_blocktime;
    opt_pack1.use_winograd_convolution = opt->use_winograd_convolution;
    opt_pack1.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_pack1.use_int8_inference = opt->use_int8_inference;
    opt_pack1.use_vulkan_compute = opt->use_vulkan_compute;
    opt_pack1.use_bf16_storage = opt->use_bf16_storage;
    opt_pack1.use_fp16_packed = opt->use_fp16_packed;
    opt_pack1.use_fp16_storage = opt->use_fp16_storage;
    opt_pack1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_pack1.use_int8_packed = opt->use_int8_packed;
    opt_pack1.use_int8_storage = opt->use_int8_storage;
    opt_pack1.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_pack1.use_packing_layout = opt->use_packing_layout;
    opt_pack1.use_shader_pack8 = opt->use_shader_pack8;
    opt_pack1.use_subgroup_basic = opt->use_subgroup_basic;
    opt_pack1.use_subgroup_vote = opt->use_subgroup_vote;
    opt_pack1.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_pack1.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_pack1.use_image_storage = opt->use_image_storage;
    opt_pack1.use_tensor_storage = opt->use_tensor_storage;
    opt_pack1.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_pack1.flush_denormals = opt->flush_denormals;
    opt_pack1.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_pack1.use_reserved_1 = opt->use_reserved_1;
    opt_pack1.use_reserved_2 = opt->use_reserved_2;
    opt_pack1.use_reserved_3 = opt->use_reserved_3;
    opt_pack1.use_reserved_4 = opt->use_reserved_4;
    opt_pack1.use_reserved_5 = opt->use_reserved_5;
    opt_pack1.use_reserved_6 = opt->use_reserved_6;
    opt_pack1.use_reserved_7 = opt->use_reserved_7;
    opt_pack1.use_reserved_8 = opt->use_reserved_8;
    opt_pack1.use_reserved_9 = opt->use_reserved_9;
    opt_pack1.use_reserved_10 = opt->use_reserved_10;
    opt_pack1.use_reserved_11 = opt->use_reserved_11;
    opt_pack1.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,&local_158,1,&opt_pack1);
  }
  iVar11 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86_avx2 +
                            (long)this->_vptr_Padding_x86_avx2[-3]),&local_158,top_blob,opt);
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + -1;
    UNLOCK();
    if (*local_158.refcount == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int Padding_x86_avx2::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}